

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O3

Terminator * __thiscall soul::ModuleCloner::cloneTerminator(ModuleCloner *this,Terminator *s)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar2;
  PoolItem *pPVar3;
  undefined4 extraout_var_01;
  void *in_R8;
  undefined1 auVar4 [16];
  
  iVar1 = 0;
  auVar4 = __dynamic_cast(s,&heart::Terminator::typeinfo,&heart::Branch::typeinfo);
  if (auVar4._0_8_ != (__fn *)0x0) {
    iVar1 = clone(this,auVar4._0_8_,auVar4._8_8_,iVar1,in_R8);
    return (Terminator *)CONCAT44(extraout_var,iVar1);
  }
  iVar1 = 0;
  auVar4 = __dynamic_cast(s,&heart::Terminator::typeinfo,&heart::BranchIf::typeinfo);
  if (auVar4._0_8_ != (__fn *)0x0) {
    iVar1 = clone(this,auVar4._0_8_,auVar4._8_8_,iVar1,in_R8);
    return (Terminator *)CONCAT44(extraout_var_00,iVar1);
  }
  lVar2 = __dynamic_cast(s,&heart::Terminator::typeinfo,&heart::ReturnVoid::typeinfo);
  if (lVar2 != 0) {
    pPVar3 = PoolAllocator::allocateSpaceForObject(&this->newModule->allocator->pool,0x18);
    pPVar3->item = (void *)0x0;
    *(undefined8 *)&pPVar3->field_0x18 = 0;
    pPVar3[1].size = 0;
    pPVar3->item = &PTR__Object_002fa6b8;
    pPVar3->destructor =
         PoolAllocator::allocate<soul::heart::ReturnVoid>::anon_class_1_0_00000001::__invoke;
    return (Terminator *)&pPVar3->item;
  }
  iVar1 = 0;
  auVar4 = __dynamic_cast(s,&heart::Terminator::typeinfo,&heart::ReturnValue::typeinfo);
  if (auVar4._0_8_ != (__fn *)0x0) {
    iVar1 = clone(this,auVar4._0_8_,auVar4._8_8_,iVar1,in_R8);
    return (Terminator *)CONCAT44(extraout_var_01,iVar1);
  }
  throwInternalCompilerError("cloneTerminator",0x149);
}

Assistant:

heart::Terminator& cloneTerminator (heart::Terminator& s)
    {
        #define SOUL_CLONE_TERMINATOR(Type)    if (auto t = cast<const heart::Type> (s)) return clone (*t);
        SOUL_HEART_TERMINATORS (SOUL_CLONE_TERMINATOR)
        #undef SOUL_CLONE_TERMINATOR
        SOUL_ASSERT_FALSE;
        return s;
    }